

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O3

string * __thiscall Worker::ReplaceRNUMEx(string *__return_storage_ptr__,Worker *this,string *in)

{
  pointer pcVar1;
  char *pcVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  string to;
  string from;
  random_device rd;
  char *local_1420;
  long local_1418;
  char local_1410 [16];
  undefined1 *local_1400 [2];
  undefined1 local_13f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_13e0;
  char *local_13d8;
  uint local_13d0;
  char local_13c8 [16];
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  local_1400[0] = local_13f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1400,"$RNUM(","");
  local_13e0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_13e0;
  pcVar1 = (in->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + in->_M_string_length);
  uVar6 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_1400[0],0);
  if (uVar6 != 0xffffffffffffffff) {
    do {
      lVar7 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1093ad,uVar6);
      std::__cxx11::string::substr((ulong)&local_1420,(ulong)__return_storage_ptr__);
      pcVar2 = local_1420;
      uVar5 = atoi(local_1420);
      if (pcVar2 != local_1410) {
        operator_delete(pcVar2);
      }
      local_1420 = local_1410;
      local_1418 = 0;
      local_1410[0] = '\0';
      if ((int)uVar5 < 1) {
        std::__cxx11::string::_M_replace((ulong)&local_1420,0,(char *)0x0,0x10936d);
      }
      else {
        uVar8 = std::random_device::_M_getval();
        uVar8 = (uVar8 & 0xffffffff) % (ulong)uVar5;
        uVar5 = (uint)uVar8;
        cVar4 = '\x01';
        if (9 < uVar5) {
          cVar3 = '\x04';
          do {
            cVar4 = cVar3;
            uVar9 = (uint)uVar8;
            if (uVar9 < 100) {
              cVar4 = cVar4 + -2;
              goto LAB_001058b7;
            }
            if (uVar9 < 1000) {
              cVar4 = cVar4 + -1;
              goto LAB_001058b7;
            }
            if (uVar9 < 10000) goto LAB_001058b7;
            uVar8 = uVar8 / 10000;
            cVar3 = cVar4 + '\x04';
          } while (99999 < uVar9);
          cVar4 = cVar4 + '\x01';
        }
LAB_001058b7:
        local_13d8 = local_13c8;
        std::__cxx11::string::_M_construct((ulong)&local_13d8,cVar4);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_13d8,local_13d0,uVar5);
        std::__cxx11::string::operator=((string *)&local_1420,(string *)&local_13d8);
        if (local_13d8 != local_13c8) {
          operator_delete(local_13d8);
        }
      }
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,uVar6,(char *)((lVar7 - uVar6) + 1),(ulong)local_1420
                );
      uVar6 = std::__cxx11::string::find
                        ((char *)__return_storage_ptr__,(ulong)local_1400[0],uVar6 + local_1418);
      if (local_1420 != local_1410) {
        operator_delete(local_1420);
      }
    } while (uVar6 != 0xffffffffffffffff);
  }
  if (local_1400[0] != local_13f0) {
    operator_delete(local_1400[0]);
  }
  std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

string Worker::ReplaceRNUMEx(const string in) {
    random_device rd;

    string from = "$RNUM(";
    string subject = in;
    string::size_type s_pos = subject.find(from);

    while (s_pos != string::npos) {
        string::size_type e_pos = subject.find(")", s_pos);
        int m = atoi(subject.substr(s_pos + from.size(), e_pos).c_str());
        string to;
        if (m > 0) {
            to = to_string(rd() % m);
        }else{
            to = "";
        }
        subject.replace(s_pos, e_pos - s_pos +1, to);
        s_pos = subject.find(from, s_pos + to.size());
    }

    return subject;
}